

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O3

void __thiscall
cmGlobVerificationManager::CacheEntryKey::PrintGlobCommand
          (CacheEntryKey *this,ostream *out,string *cmdVar)

{
  ostream *poVar1;
  char *pcVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"file(GLOB",9);
  pcVar2 = "_RECURSE ";
  if (this->Recurse == false) {
    pcVar2 = " ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,(ulong)this->Recurse * 8 + 1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(cmdVar->_M_dataplus)._M_p,cmdVar->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  if ((this->Recurse == true) && (this->FollowSymlinks == true)) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"FOLLOW_SYMLINKS ",0x10);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"LIST_DIRECTORIES ",0x11);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(out,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  if ((this->Relative)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"RELATIVE \"",10);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(this->Relative)._M_dataplus._M_p,(this->Relative)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" ",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"\"",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(this->Expression)._M_dataplus._M_p,(this->Expression)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")",2);
  return;
}

Assistant:

void cmGlobVerificationManager::CacheEntryKey::PrintGlobCommand(
  std::ostream& out, const std::string& cmdVar)
{
  out << "file(GLOB" << (this->Recurse ? "_RECURSE " : " ");
  out << cmdVar << " ";
  if (this->Recurse && this->FollowSymlinks) {
    out << "FOLLOW_SYMLINKS ";
  }
  out << "LIST_DIRECTORIES " << this->ListDirectories << " ";
  if (!this->Relative.empty()) {
    out << "RELATIVE \"" << this->Relative << "\" ";
  }
  out << "\"" << this->Expression << "\")";
}